

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O0

Amap_Cut_t * Amap_ManCutCreate(Amap_Man_t *p,Amap_Cut_t *pCut0,Amap_Cut_t *pCut1,int iMat)

{
  Amap_Cut_t *pAVar1;
  int iVar2;
  Amap_Cut_t *pCut_00;
  Amap_Cut_t **ppAVar3;
  int nBytes;
  int nSize;
  int i;
  Amap_Cut_t *pCut;
  int iMat_local;
  Amap_Cut_t *pCut1_local;
  Amap_Cut_t *pCut0_local;
  Amap_Man_t *p_local;
  
  iVar2 = ((uint)*pCut0 >> 0x11) + ((uint)*pCut1 >> 0x11);
  if (((uint)*pCut1 & 0xffff) <= ((uint)*pCut0 & 0xffff)) {
    pCut_00 = (Amap_Cut_t *)Aig_MmFlexEntryFetch(p->pMemTemp,iVar2 * 4 + 0xc);
    *pCut_00 = (Amap_Cut_t)((uint)*pCut_00 & 0xffff0000 | iMat & 0xffffU);
    *pCut_00 = (Amap_Cut_t)((uint)*pCut_00 & 0xfffeffff);
    *pCut_00 = (Amap_Cut_t)((uint)*pCut_00 & 0x1ffff | iVar2 * 0x20000);
    for (nBytes = 0; nBytes < (int)((uint)*pCut0 >> 0x11); nBytes = nBytes + 1) {
      pCut_00[(long)nBytes + 1] = pCut0[(long)nBytes + 1];
    }
    for (nBytes = 0; nBytes < (int)((uint)*pCut1 >> 0x11); nBytes = nBytes + 1) {
      pCut_00[(long)(int)(((uint)*pCut0 >> 0x11) + nBytes) + 1] = pCut1[(long)nBytes + 1];
    }
    if (p->ppCutsTemp[(uint)*pCut_00 & 0xffff] == (Amap_Cut_t *)0x0) {
      Vec_IntPushOrder(p->vTemp,(uint)*pCut_00 & 0xffff);
    }
    pAVar1 = p->ppCutsTemp[(uint)*pCut_00 & 0xffff];
    ppAVar3 = Amap_ManCutNextP(pCut_00);
    *ppAVar3 = pAVar1;
    p->ppCutsTemp[(uint)*pCut_00 & 0xffff] = pCut_00;
    return pCut_00;
  }
  __assert_fail("pCut0->iMat >= pCut1->iMat",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMerge.c"
                ,0x6f,"Amap_Cut_t *Amap_ManCutCreate(Amap_Man_t *, Amap_Cut_t *, Amap_Cut_t *, int)"
               );
}

Assistant:

Amap_Cut_t * Amap_ManCutCreate( Amap_Man_t * p, 
    Amap_Cut_t * pCut0, Amap_Cut_t * pCut1, int iMat )
{
    Amap_Cut_t * pCut;
    int i, nSize  = pCut0->nFans + pCut1->nFans;
    int nBytes = sizeof(Amap_Cut_t) + sizeof(int) * nSize + sizeof(Amap_Cut_t *);
    assert( pCut0->iMat >= pCut1->iMat );
    pCut = (Amap_Cut_t *)Aig_MmFlexEntryFetch( p->pMemTemp, nBytes );
    pCut->iMat  = iMat;
    pCut->fInv  = 0;
    pCut->nFans = nSize;
    for ( i = 0; i < (int)pCut0->nFans; i++ )
        pCut->Fans[i] = pCut0->Fans[i];
    for ( i = 0; i < (int)pCut1->nFans; i++ )
        pCut->Fans[pCut0->nFans+i] = pCut1->Fans[i];
    // add it to storage
    if ( p->ppCutsTemp[ pCut->iMat ] == NULL )
        Vec_IntPushOrder( p->vTemp, pCut->iMat );
    *Amap_ManCutNextP( pCut ) = p->ppCutsTemp[ pCut->iMat ];
    p->ppCutsTemp[ pCut->iMat ] = pCut;
    return pCut;
}